

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall kj::Promise<void>::fork(Promise<void> *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *in_RSI;
  Own<kj::_::ForkHub<kj::_::Void>,_kj::_::ForkHubBase> local_30;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> local_28;
  
  kj::_::PromiseDisposer::
  alloc<kj::_::ForkHub<kj::_::Void>,kj::_::ForkHubBase,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_30,in_RSI,(SourceLocation *)&stack0x00000008);
  Own<kj::_::ForkHub<kj::_::Void>,decltype(nullptr)>::
  Own<kj::_::ForkHub<kj::_::Void>,kj::_::ForkHubBase,void>
            ((Own<kj::_::ForkHub<kj::_::Void>,decltype(nullptr)> *)&local_28,&local_30);
  (this->super_PromiseBase).node.ptr = (PromiseNode *)local_28.disposer;
  this[1].super_PromiseBase.node.ptr = (PromiseNode *)local_28.ptr;
  local_28.ptr = (ForkHub<kj::_::Void> *)0x0;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&local_28);
  Own<kj::_::ForkHub<kj::_::Void>,_kj::_::ForkHubBase>::dispose(&local_30);
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork(SourceLocation location) {
  return ForkedPromise<T>(false,
      _::PromiseDisposer::alloc<_::ForkHub<_::FixVoid<T>>, _::ForkHubBase>(kj::mv(node), location));
}